

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O1

bool __thiscall miniros::PollSet::delEvents(PollSet *this,int sock,int events)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  __sighandler_t __handler;
  _Base_ptr p_Var4;
  uint events_00;
  string local_50;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->socket_info_mutex_);
  if (iVar2 == 0) {
    p_Var1 = &(this->socket_info_)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = (this->socket_info_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var1->_M_header;
    for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < sock]) {
      if (sock <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
    }
    p_Var4 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, sock < (int)p_Var3[1]._M_color))
    {
      p_Var4 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var4 == p_Var1) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (delEvents::loc.initialized_ == false) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"miniros.poll_set","");
        console::initializeLogLocation(&delEvents::loc,&local_50,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (delEvents::loc.level_ != Debug) {
        console::setLogLocationLevel(&delEvents::loc,Debug);
        console::checkLogLocationEnabled(&delEvents::loc);
      }
      if (delEvents::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,delEvents::loc.logger_,delEvents::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                       ,0xa1,"bool miniros::PollSet::delEvents(int, int)",
                       "PollSet: Tried to delete events [%d] to fd [%d] which does not exist in this pollset"
                       ,(ulong)(uint)events,(ulong)(uint)sock);
      }
    }
    else {
      events_00 = ~events & *(uint *)((long)&p_Var4[2]._M_right + 4);
      *(uint *)((long)&p_Var4[2]._M_right + 4) = events_00;
      set_events_on_socket(this->epfd_,sock,events_00);
      this->sockets_changed_ = true;
      signal(this,sock,__handler);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->socket_info_mutex_);
    return (_Rb_tree_header *)p_Var4 != p_Var1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool PollSet::delEvents(int sock, int events)
{
  std::scoped_lock<std::mutex> lock(socket_info_mutex_);

  M_SocketInfo::iterator it = socket_info_.find(sock);
  if (it != socket_info_.end())
  {
    it->second.events_ &= ~events;
  }
  else
  {
    MINIROS_DEBUG("PollSet: Tried to delete events [%d] to fd [%d] which does not exist in this pollset", events, sock);
    return false;
  }

  set_events_on_socket(epfd_, sock, it->second.events_);

  sockets_changed_ = true;
  signal();

  return true;
}